

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionsMap.h
# Opt level: O2

bool __thiscall
dg::dda::DefinitionsMap<dg::dda::RWNode>::
add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
          (DefinitionsMap<dg::dda::RWNode> *this,DefSite *ds,
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
          *nodes)

{
  bool bVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  
  bVar3 = false;
  for (p_Var2 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(nodes->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    bVar1 = add(this,ds,*(RWNode **)(p_Var2 + 1));
    bVar3 = (bool)(bVar3 | bVar1);
  }
  return bVar3;
}

Assistant:

bool add(const DefSite &ds, const ContainerT &nodes) {
        bool changed = false;
        for (auto *n : nodes)
            changed |= add(ds, n);
        return changed;
    }